

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::MILSpec::Value::Clear(Value *this)

{
  ulong uVar1;
  ValueType *this_00;
  undefined8 *puVar2;
  
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->docstring_);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) && (this_00 = this->type_, this_00 != (ValueType *)0x0)) {
    ValueType::~ValueType(this_00);
    operator_delete(this_00,0x20);
  }
  this->type_ = (ValueType *)0x0;
  clear_value(this);
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Value::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.MILSpec.Value)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  docstring_.ClearToEmpty();
  if (GetArenaForAllocation() == nullptr && type_ != nullptr) {
    delete type_;
  }
  type_ = nullptr;
  clear_value();
  _internal_metadata_.Clear<std::string>();
}